

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ConditionalRenderInverted::FunctionalTest::setupColor(FunctionalTest *this,GLfloat red)

{
  int iVar1;
  undefined4 uVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  GLuint location;
  Functions *gl;
  GLfloat red_local;
  FunctionalTest *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  uVar2 = (**(code **)(lVar5 + 0xb48))(this->m_po_id,"color");
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glGetUniformLocation() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                  ,0x20f);
  (**(code **)(lVar5 + 0x14e0))(red,uVar2);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glUniform1f() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                  ,0x213);
  return;
}

Assistant:

void gl4cts::ConditionalRenderInverted::FunctionalTest::setupColor(const glw::GLfloat red)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetch where to set. */
	glw::GLuint location = gl.getUniformLocation(m_po_id, s_color_uniform_name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() call failed.");

	/* Set. */
	gl.uniform1f(location, red);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1f() call failed.");
}